

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

int vfio_enable_msi(int device_fd)

{
  int iVar1;
  int *piVar2;
  int in_EDI;
  char buf [512];
  int err;
  int64_t result;
  vfio_irq_set *irq_set;
  int event_fd;
  int *fd_ptr;
  char irq_set_buf [24];
  undefined1 local_258 [524];
  int local_4c;
  long local_48;
  undefined4 *local_40;
  int local_34;
  int *local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  int local_14 [4];
  int local_4;
  
  local_4 = in_EDI;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Enable MSI Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x30,
          "vfio_enable_msi");
  local_34 = eventfd(0,0);
  local_40 = &local_28;
  local_28 = 0x18;
  local_18 = 1;
  local_24 = 0x24;
  local_20 = 1;
  local_1c = 0;
  local_30 = local_14;
  local_14[0] = local_34;
  iVar1 = ioctl(local_4,0x3b6e,local_40);
  local_48 = (long)iVar1;
  if (local_48 == -1) {
    piVar2 = __errno_location();
    local_4c = *piVar2;
    __xpg_strerror_r(local_4c,local_258,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0x40,"vfio_enable_msi","enable MSI interrupts",local_258);
    exit(local_4c);
  }
  return local_34;
}

Assistant:

int vfio_enable_msi(int device_fd) {
	info("Enable MSI Interrupts");
	char irq_set_buf[IRQ_SET_BUF_LEN];
	int* fd_ptr;

	// setup event fd
	int event_fd = eventfd(0, 0);

	struct vfio_irq_set* irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(irq_set_buf);
	irq_set->count = 1;
	irq_set->flags = VFIO_IRQ_SET_DATA_EVENTFD | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSI_IRQ_INDEX;
	irq_set->start = 0;
	fd_ptr = (int*) &irq_set->data;
	*fd_ptr = event_fd;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "enable MSI interrupts");

	return event_fd;
}